

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O3

long __thiscall glcts::anon_unknown_0::NegativeBind::Run(NegativeBind *this)

{
  CallLogWrapper *this_00;
  GLuint *textures;
  GLenum GVar1;
  undefined8 in_RAX;
  char *format;
  GLint max_image_units;
  
  max_image_units = (GLint)((ulong)in_RAX >> 0x20);
  this_00 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glGetIntegerv(this_00,0x8f38,&max_image_units);
  textures = &this->m_texture;
  glu::CallLogWrapper::glGenTextures(this_00,1,textures);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,this->m_texture);
  glu::CallLogWrapper::glTexStorage2D(this_00,0xde1,1,0x8814,0x40,0x40);
  glu::CallLogWrapper::glBindImageTexture
            (this_00,max_image_units,this->m_texture,0,'\0',0,35000,0x8814);
  GVar1 = glu::CallLogWrapper::glGetError(this_00);
  if (GVar1 == 0x501) {
    glu::CallLogWrapper::glBindImageTexture(this_00,0,0x7b,0,'\0',0,35000,0x8814);
    GVar1 = glu::CallLogWrapper::glGetError(this_00);
    if (GVar1 == 0x501) {
      glu::CallLogWrapper::glBindImageTexture(this_00,1,*textures,0,'\0',0,35000,0x1908);
      GVar1 = glu::CallLogWrapper::glGetError(this_00);
      if (GVar1 == 0x501) {
        glu::CallLogWrapper::glBindImageTexture(this_00,1,*textures,-1,'\0',0,35000,0x8814);
        GVar1 = glu::CallLogWrapper::glGetError(this_00);
        if (GVar1 == 0x501) {
          glu::CallLogWrapper::glBindImageTexture(this_00,1,*textures,0,'\0',-1,35000,0x8814);
          GVar1 = glu::CallLogWrapper::glGetError(this_00);
          if (GVar1 == 0x501) {
            glu::CallLogWrapper::glGenTextures(this_00,1,&this->m_texture2);
            glu::CallLogWrapper::glBindTexture(this_00,0xde1,this->m_texture2);
            glu::CallLogWrapper::glBindImageTexture
                      (this_00,1,this->m_texture2,0,'\0',0,35000,0x8814);
            GVar1 = glu::CallLogWrapper::glGetError(this_00);
            if (GVar1 == 0x502) {
              return 0;
            }
            format = 
            "BindImageTexture should generate INVALID_OPERATION if <texture> is a mutable texture object.\n"
            ;
          }
          else {
            format = 
            "BindImageTexture should generate INVALID_VALUE if <layer> is less than zero.\n";
          }
        }
        else {
          format = "BindImageTexture should generate INVALID_VALUE if <level> is less than zero.\n";
        }
      }
      else {
        format = 
        "BindImageTexture should generate INVALID_VALUE if <format> is not a legal format.\n";
      }
    }
    else {
      format = 
      "BindImageTexture should generate INVALID_VALUE if <texture> is not the name of an existing texture object.\n"
      ;
    }
  }
  else {
    format = 
    "BindImageTexture should generate INVALID_VALUE if <unit> is greater than or equal to the value of MAX_IMAGE_UNITS.\n"
    ;
  }
  anon_unknown_0::Output(format);
  return -1;
}

Assistant:

virtual long Run()
	{
		GLint max_image_units;
		glGetIntegerv(GL_MAX_IMAGE_UNITS, &max_image_units);
		glGenTextures(1, &m_texture);
		glBindTexture(GL_TEXTURE_2D, m_texture);
		glTexStorage2D(GL_TEXTURE_2D, 1, GL_RGBA32F, 64, 64);

		glBindImageTexture(max_image_units, m_texture, 0, GL_FALSE, 0, GL_READ_ONLY, GL_RGBA32F);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("BindImageTexture should generate INVALID_VALUE if <unit> is greater than or equal to the value of "
				   "MAX_IMAGE_UNITS.\n");
			return ERROR;
		}

		glBindImageTexture(0, 123, 0, GL_FALSE, 0, GL_READ_ONLY, GL_RGBA32F);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("BindImageTexture should generate INVALID_VALUE if <texture> is not the name of an existing texture "
				   "object.\n");
			return ERROR;
		}

		glBindImageTexture(1, m_texture, 0, GL_FALSE, 0, GL_READ_ONLY, GL_RGBA);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("BindImageTexture should generate INVALID_VALUE if <format> is not a legal format.\n");
			return ERROR;
		}

		glBindImageTexture(1, m_texture, -1, GL_FALSE, 0, GL_READ_ONLY, GL_RGBA32F);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("BindImageTexture should generate INVALID_VALUE if <level> is less than zero.\n");
			return ERROR;
		}

		glBindImageTexture(1, m_texture, 0, GL_FALSE, -1, GL_READ_ONLY, GL_RGBA32F);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("BindImageTexture should generate INVALID_VALUE if <layer> is less than zero.\n");
			return ERROR;
		}

		glGenTextures(1, &m_texture2);
		glBindTexture(GL_TEXTURE_2D, m_texture2);
		glBindImageTexture(1, m_texture2, 0, GL_FALSE, 0, GL_READ_ONLY, GL_RGBA32F);
		if (glGetError() != GL_INVALID_OPERATION)
		{
			Output("BindImageTexture should generate INVALID_OPERATION if <texture> is a mutable texture object.\n");
			return ERROR;
		}

		return NO_ERROR;
	}